

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

ApplyBrace * __thiscall
jsonnet::internal::Allocator::
make<jsonnet::internal::ApplyBrace,jsonnet::internal::LocationRange,std::vector<jsonnet::internal::FodderElement,std::allocator<jsonnet::internal::FodderElement>>const&,jsonnet::internal::AST*&,jsonnet::internal::AST*&>
          (Allocator *this,LocationRange *args,
          vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
          *args_1,AST **args_2,AST **args_3)

{
  size_t *psVar1;
  AST *pAVar2;
  AST *pAVar3;
  ApplyBrace *this_00;
  _List_node_base *p_Var4;
  
  this_00 = (ApplyBrace *)operator_new(0x90);
  pAVar2 = *args_2;
  pAVar3 = *args_3;
  AST::AST((AST *)this_00,args,AST_APPLY_BRACE,args_1);
  (this_00->super_AST)._vptr_AST = (_func_int **)&PTR__AST_0023a1f0;
  this_00->left = pAVar2;
  this_00->right = pAVar3;
  p_Var4 = (_List_node_base *)operator_new(0x18);
  p_Var4[1]._M_next = (_List_node_base *)this_00;
  std::__detail::_List_node_base::_M_hook(p_Var4);
  psVar1 = &(this->allocated).
            super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>.
            _M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return this_00;
}

Assistant:

T *make(Args &&... args)
    {
        auto r = new T(std::forward<Args>(args)...);
        allocated.push_back(r);
        return r;
    }